

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.hpp
# Opt level: O3

void __thiscall
boost::runtime::arguments_store::set<std::__cxx11::string>
          (arguments_store *this,cstring *parameter_name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  pointer pcVar1;
  element_type *peVar2;
  shared_count sVar3;
  typed_argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p;
  mapped_type *pmVar4;
  shared_ptr<boost::runtime::argument> local_48;
  element_type *local_30;
  shared_count local_28;
  
  p = (typed_argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)operator_new(0x30);
  (p->super_argument).p_value_type =
       (id_t)&rtti::rtti_detail::rttid_holder<std::__cxx11::string>::inst()::s_inst_abi_cxx11_;
  (p->super_argument)._vptr_argument = (_func_int **)&PTR__typed_argument_001ca350;
  (p->p_value).
  super_class_property<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .value._M_dataplus._M_p =
       (pointer)&(p->p_value).
                 super_class_property<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .value.field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&p->p_value,pcVar1,pcVar1 + value->_M_string_length);
  shared_ptr<boost::runtime::argument>::
  shared_ptr<boost::runtime::typed_argument<std::__cxx11::string>>(&local_48,p);
  pmVar4 = std::
           map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
           ::operator[](&this->m_arguments,parameter_name);
  sVar3.pi_ = local_48.pn.pi_;
  peVar2 = local_48.px;
  local_48.px = (element_type *)0x0;
  local_48.pn.pi_ = (sp_counted_base *)0x0;
  local_30 = pmVar4->px;
  local_28.pi_ = (pmVar4->pn).pi_;
  pmVar4->px = peVar2;
  (pmVar4->pn).pi_ = sVar3.pi_;
  detail::shared_count::~shared_count(&local_28);
  detail::shared_count::~shared_count(&local_48.pn);
  return;
}

Assistant:

void        set( cstring parameter_name, T const& value )
    {
        m_arguments[parameter_name] = argument_ptr( new typed_argument<T>( value ) );
    }